

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O0

Sexp * Builtin_Div(Sexp *fst,Sexp *snd)

{
  pointer ptVar1;
  bool bVar2;
  JetRuntimeException *pJVar3;
  Sexp *pSVar4;
  allocator local_a1;
  string local_a0 [38];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [38];
  undefined1 local_52;
  allocator local_51;
  string local_50 [48];
  FrameProtector local_20;
  FrameProtector __frame_prot;
  Sexp *snd_local;
  Sexp *fst_local;
  
  __frame_prot.protected_frame = (Frame *)snd;
  snd_local = fst;
  FrameProtector::FrameProtector(&local_20,"Builtin_Div");
  FrameProtector::ProtectValue(&local_20,&snd_local,"fst");
  FrameProtector::ProtectValue(&local_20,(Sexp **)&__frame_prot,"snd");
  bVar2 = Sexp::IsFixnum(snd_local);
  if (!bVar2) {
    local_52 = 1;
    pJVar3 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"type error: not a fixnum",&local_51);
    JetRuntimeException::JetRuntimeException(pJVar3,(string *)local_50);
    local_52 = 0;
    __cxa_throw(pJVar3,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  bVar2 = Sexp::IsFixnum((Sexp *)__frame_prot.protected_frame);
  if (!bVar2) {
    local_7a = 1;
    pJVar3 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"type error: not a fixnum",&local_79);
    JetRuntimeException::JetRuntimeException(pJVar3,(string *)local_78);
    local_7a = 0;
    __cxa_throw(pJVar3,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  ptVar1 = ((__frame_prot.protected_frame)->roots).
           super__Vector_base<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((double)ptVar1 == 0.0) && (!NAN((double)ptVar1))) {
    pJVar3 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"divided by zero",&local_a1);
    JetRuntimeException::JetRuntimeException(pJVar3,(string *)local_a0);
    __cxa_throw(pJVar3,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  pSVar4 = GcHeap::AllocateFixnum
                     ((snd_local->field_1).fixnum_value /
                      (double)((__frame_prot.protected_frame)->roots).
                              super__Vector_base<std::tuple<const_char_*,_Sexp_**>,_std::allocator<std::tuple<const_char_*,_Sexp_**>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
  FrameProtector::~FrameProtector(&local_20);
  return pSVar4;
}

Assistant:

Sexp *Builtin_Div(Sexp *fst, Sexp *snd) {
  GC_HELPER_FRAME;
  GC_PROTECT(fst);
  GC_PROTECT(snd);

  if (!fst->IsFixnum()) {
    throw JetRuntimeException("type error: not a fixnum");
  }

  if (!snd->IsFixnum()) {
    throw JetRuntimeException("type error: not a fixnum");
  }

  if (snd->fixnum_value == 0) {
    throw JetRuntimeException("divided by zero");
  }

  return GcHeap::AllocateFixnum(fst->fixnum_value / snd->fixnum_value);
}